

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

void __thiscall QAccessibleComboBox::doAction(QAccessibleComboBox *this,QString *actionName)

{
  long lVar1;
  char cVar2;
  QComboBox *this_00;
  long lVar3;
  QAbstractItemView *pQVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (this_00 != (QComboBox *)0x0) {
    lVar3 = QAccessibleActionInterface::showMenuAction();
    lVar1 = (actionName->d).size;
    if (lVar1 == *(long *)(lVar3 + 0x10)) {
      QVar5.m_data = (actionName->d).ptr;
      QVar5.m_size = lVar1;
      QVar7.m_data = *(storage_type_conflict **)(lVar3 + 8);
      QVar7.m_size = *(long *)(lVar3 + 0x10);
      cVar2 = QtPrivate::equalStrings(QVar5,QVar7);
      if (cVar2 != '\0') goto LAB_0051fea6;
    }
    lVar3 = QAccessibleActionInterface::pressAction();
    lVar1 = (actionName->d).size;
    if (lVar1 == *(long *)(lVar3 + 0x10)) {
      QVar6.m_data = (actionName->d).ptr;
      QVar6.m_size = lVar1;
      QVar8.m_data = *(storage_type_conflict **)(lVar3 + 8);
      QVar8.m_size = *(long *)(lVar3 + 0x10);
      cVar2 = QtPrivate::equalStrings(QVar6,QVar8);
      if (cVar2 != '\0') {
LAB_0051fea6:
        pQVar4 = QComboBox::view(this_00);
        (**(code **)(*(long *)&this_00->super_QWidget + 0x1a8 +
                    (ulong)(ushort)((ushort)((pQVar4->super_QAbstractScrollArea).super_QFrame.
                                             super_QWidget.data)->widget_attributes >> 0xf) * 8))
                  (this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void QAccessibleComboBox::doAction(const QString &actionName)
{
    if (QComboBox *cBox = comboBox()) {
        if (actionName == showMenuAction() || actionName == pressAction()) {
            if (cBox->view()->isVisible()) {
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    cBox->setCurrentIndex(list->selectedRows().at(0));
                }
                cBox->setFocus();
#endif
                cBox->hidePopup();
            } else {
                cBox->showPopup();
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    auto selectedCells = list->selectedCells();
                    QAccessibleEvent ev(selectedCells.at(0),QAccessible::Focus);
                    QAccessible::updateAccessibility(&ev);
                }
#endif
            }
        }
    }
}